

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceGroup.cxx
# Opt level: O1

void __thiscall
cmSourceGroup::cmSourceGroup(cmSourceGroup *this,char *name,char *regex,char *parentName)

{
  string *psVar1;
  _Rb_tree_header *p_Var2;
  char *pcVar3;
  cmSourceGroupInternals *pcVar4;
  allocator local_31;
  
  std::__cxx11::string::string((string *)this,name,&local_31);
  psVar1 = &this->FullName;
  (this->FullName)._M_dataplus._M_p = (pointer)&(this->FullName).field_2;
  (this->FullName)._M_string_length = 0;
  (this->FullName).field_2._M_local_buf[0] = '\0';
  (this->GroupRegex).program = (char *)0x0;
  p_Var2 = &(this->GroupFiles)._M_t._M_impl.super__Rb_tree_header;
  (this->GroupFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->GroupFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->GroupFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->GroupFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->GroupFiles)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->SourceFiles).
  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->SourceFiles).
  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->SourceFiles).
  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar4 = (cmSourceGroupInternals *)operator_new(0x18);
  (pcVar4->GroupChildren).super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pcVar4->GroupChildren).super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pcVar4->GroupChildren).super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->Internal = pcVar4;
  SetGroupRegex(this,regex);
  if (parentName != (char *)0x0) {
    pcVar3 = (char *)(this->FullName)._M_string_length;
    strlen(parentName);
    std::__cxx11::string::_M_replace((ulong)psVar1,0,pcVar3,(ulong)parentName);
    std::__cxx11::string::append((char *)psVar1);
  }
  std::__cxx11::string::_M_append((char *)psVar1,(ulong)(this->Name)._M_dataplus._M_p);
  return;
}

Assistant:

cmSourceGroup::cmSourceGroup(const char* name, const char* regex,
                             const char* parentName)
  : Name(name)
{
  this->Internal = new cmSourceGroupInternals;
  this->SetGroupRegex(regex);
  if (parentName) {
    this->FullName = parentName;
    this->FullName += "\\";
  }
  this->FullName += this->Name;
}